

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDataQueue.cpp
# Opt level: O3

void __thiscall MinVR::VRDataQueue::push(VRDataQueue *this,VRDataIndex *event)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  VRDataIndex *this_00;
  timeval tp;
  VRDataQueueItem local_50;
  timeval local_28;
  
  this_00 = (VRDataIndex *)operator_new(0x98);
  VRDataIndex::VRDataIndex(this_00,event);
  gettimeofday(&local_28,(__timezone_ptr_t)0x0);
  paVar1 = &local_50._serialData.field_2;
  local_50._serialData._M_string_length = 0;
  local_50._serialData.field_2._M_local_buf[0] = '\0';
  local_50._dataIndex = this_00;
  local_50._serialData._M_dataplus._M_p = (pointer)paVar1;
  push(this,local_28.tv_sec * 1000000 + local_28.tv_usec,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._serialData._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._serialData._M_dataplus._M_p,
                    CONCAT71(local_50._serialData.field_2._M_allocated_capacity._1_7_,
                             local_50._serialData.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void VRDataQueue::push(const VRDataIndex event) {
  VRDataIndex* eventPtr = new VRDataIndex(event);
  push(makeTimeStamp(), VRDataQueueItem(eventPtr));
}